

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O0

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::find_ass_cbit_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id,uint64_t *empty_id)

{
  bool bVar1;
  uint64_t *in_RDX;
  uint64_t in_RDI;
  uint64_t num_cbits;
  uint64_t num_vbits;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_ffffffffffffffd0;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this_00;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *local_28;
  uint64_t local_18;
  uint64_t local_8;
  
  local_28 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)0x0;
  do {
    bVar1 = get_vbit_(in_stack_ffffffffffffffd0,in_RDI);
    if (bVar1) {
      local_28 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                 ((long)&(local_28->hasher_).shift_ + 1);
    }
    local_18 = left_(in_stack_ffffffffffffffd0,in_RDI);
    bVar1 = is_vacant_(in_stack_ffffffffffffffd0,in_RDI);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  *in_RDX = local_18;
  if (local_28 == (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    this_00 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)0x0;
    while (this_00 < local_28) {
      local_18 = right_(this_00,in_RDI);
      bVar1 = get_cbit_(this_00,in_RDI);
      if (bVar1) {
        this_00 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
                  ((long)&(this_00->hasher_).shift_ + 1);
      }
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

uint64_t find_ass_cbit_(uint64_t slot_id, uint64_t& empty_id) const {
        uint64_t num_vbits = 0;
        do {
            if (get_vbit_(slot_id)) {
                ++num_vbits;
            }
            slot_id = left_(slot_id);
        } while (!is_vacant_(slot_id));

        empty_id = slot_id;

        if (num_vbits == 0) {
            return UINT64_MAX;
        }

        uint64_t num_cbits = 0;
        while (num_cbits < num_vbits) {
            slot_id = right_(slot_id);
            if (get_cbit_(slot_id)) {
                ++num_cbits;
            }
        }

        return slot_id;
    }